

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_four.h
# Opt level: O3

void __thiscall ConnectFourState::print(ConnectFourState *this,ostream *out)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  char local_3d;
  char local_3c;
  char local_3b [3];
  long local_38;
  
  cVar1 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  if (this->num_cols < 2) {
    iVar6 = this->num_cols + -1;
  }
  else {
    iVar5 = 0;
    do {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,iVar5);
      local_3d = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_3d,1);
      iVar5 = iVar5 + 1;
      iVar6 = this->num_cols + -1;
    } while (iVar5 < iVar6);
  }
  plVar3 = (long *)std::ostream::operator<<((ostream *)out,iVar6);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  if (0 < this->num_rows) {
    lVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"|",1);
      local_38 = lVar8;
      if ((long)this->num_cols < 2) {
        lVar4 = (long)this->num_cols + -1;
      }
      else {
        lVar7 = 0;
        do {
          local_3b[0] = *(char *)(*(long *)&(this->board).
                                            super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                            super__Vector_impl_data + lVar7);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_3b,1);
          local_3b[1] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_3b + 1,1);
          lVar7 = lVar7 + 1;
          lVar4 = (long)this->num_cols + -1;
        } while (lVar7 < lVar4);
      }
      local_3c = *(char *)(*(long *)&(this->board).
                                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar8].
                                     super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     super__Vector_impl_data + lVar4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,&local_3c,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      lVar8 = local_38 + 1;
    } while (lVar8 < this->num_rows);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"+",1);
  if (1 < this->num_cols) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"--",2);
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->num_cols + -1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"-+",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  local_3b[2] = ".XO"[this->player_to_move];
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,local_3b + 2,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," to move ",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void print(ostream& out) const
	{
		out << endl;
		out << " ";
		for (int col = 0; col < num_cols - 1; ++col) {
			out << col << ' ';
		}
		out << num_cols - 1 << endl;
		for (int row = 0; row < num_rows; ++row) {
			out << "|";
			for (int col = 0; col < num_cols - 1; ++col) {
				out << board[row][col] << ' ';
			}
			out << board[row][num_cols - 1] << "|" << endl;
		}
		out << "+";
		for (int col = 0; col < num_cols - 1; ++col) {
			out << "--";
		}
		out << "-+" << endl;
		out << player_markers[player_to_move] << " to move " << endl << endl;
	}